

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O0

Status __thiscall
sentencepiece::SentencePieceProcessor::Normalize
          (SentencePieceProcessor *this,string_view input,string *normalized,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *norm_to_orig)

{
  bool bVar1;
  StatusBuilder *pSVar2;
  pointer pNVar3;
  string *psVar4;
  undefined8 in_R9;
  int local_1c8 [4];
  StatusBuilder local_1b8;
  undefined8 local_38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *norm_to_orig_local;
  string *normalized_local;
  SentencePieceProcessor *this_local;
  string_view input_local;
  
  this_local = (SentencePieceProcessor *)input._M_str;
  psVar4 = (string *)input._M_len;
  local_38 = in_R9;
  norm_to_orig_local = norm_to_orig;
  normalized_local = psVar4;
  input_local._M_len = (size_t)normalized;
  input_local._M_str = (char *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(psVar4->field_2)._M_local_buf);
  if (bVar1) {
    pNVar3 = std::
             unique_ptr<sentencepiece::normalizer::Normalizer,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
             ::operator->((unique_ptr<sentencepiece::normalizer::Normalizer,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
                           *)&(psVar4->field_2)._M_allocated_capacity);
    (*pNVar3->_vptr_Normalizer[4])
              (this,pNVar3,this_local,input_local._M_len,norm_to_orig_local,local_38);
  }
  else {
    util::StatusBuilder::StatusBuilder(&local_1b8,kInternal);
    pSVar2 = util::StatusBuilder::operator<<
                       (&local_1b8,(char (*) [31])"src/sentencepiece_processor.cc");
    pSVar2 = util::StatusBuilder::operator<<(pSVar2,(char (*) [2])0x339e65);
    local_1c8[0] = 0x3af;
    pSVar2 = util::StatusBuilder::operator<<(pSVar2,local_1c8);
    pSVar2 = util::StatusBuilder::operator<<(pSVar2,(char (*) [4])") [");
    pSVar2 = util::StatusBuilder::operator<<(pSVar2,(char (*) [12])"normalizer_");
    util::StatusBuilder::operator<<(pSVar2,(char (*) [3])"] ");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    util::StatusBuilder::~StatusBuilder(&local_1b8);
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::Normalize(
    absl::string_view input, std::string *normalized,
    std::vector<size_t> *norm_to_orig) const {
  CHECK_OR_RETURN(normalizer_);
  return normalizer_->Normalize(input, normalized, norm_to_orig);
}